

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  bool bVar1;
  uint uVar2;
  alpha_cluster *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint i_1;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint p;
  byte bVar17;
  uint uVar18;
  uint8 t;
  long lVar19;
  uint uVar20;
  dxt_hc *pdVar21;
  bool bVar22;
  vector<unsigned_char> selectors;
  results results;
  params params;
  params refinerParams;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint alpha_values [8];
  uint encoding_weight [8];
  dxt5_endpoint_optimizer optimizer;
  elemental_vector local_618;
  dxt_hc *local_600;
  alpha_cluster *local_5f8;
  long local_5f0;
  results local_5e8;
  params local_5d0;
  params local_5b0;
  ulong local_578;
  vector<unsigned_long_long> *local_570;
  color_quad_u8 (*local_568) [16];
  ulong local_560;
  ulong local_558;
  uchar *local_550;
  unsigned_long_long *local_548;
  uint *local_540;
  uchar *local_538;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  results local_518;
  uint local_508 [8];
  dxt_endpoint_refiner local_4e8;
  uint auStack_4d8 [8];
  uint auStack_4b8 [10];
  dxt5_endpoint_optimizer local_490;
  
  uVar2 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_4e8);
  local_618.m_p = (uint8 *)0x0;
  local_618.m_size = 0;
  local_618.m_capacity = 0;
  if ((uint)data < (this->m_alpha_clusters).m_size) {
    local_570 = this->m_block_selectors;
    local_600 = this;
    do {
      uVar8 = data & 0xffffffff;
      lVar9 = uVar8 * 0x90;
      paVar3 = (this->m_alpha_clusters).m_p;
      uVar12 = (uint)data;
      pdVar21 = this;
      if (paVar3[uVar8].pixels.m_size != 0) {
        local_5d0.m_block_index = 0;
        local_5d0.m_pPixels = paVar3[uVar8].pixels.m_p;
        uVar14 = paVar3[uVar8].pixels.m_size;
        local_5d0.m_comp_index = 0;
        local_5d0.m_quality = cCRNDXTQualityUber;
        local_5d0.m_use_both_block_types = false;
        local_5f8 = paVar3;
        local_5f0 = lVar9;
        local_5d0.m_num_pixels = uVar14;
        if (local_618.m_size != uVar14) {
          if (local_618.m_size <= uVar14) {
            if (local_618.m_capacity < uVar14) {
              elemental_vector::increase_capacity
                        (&local_618,uVar14,local_618.m_size + 1 == uVar14,1,(object_mover)0x0,false)
              ;
            }
            memset((uint8 *)((long)local_618.m_p + (local_618._8_8_ & 0xffffffff)),0,
                   (ulong)(uVar14 - local_618.m_size));
          }
          local_618.m_size = uVar14;
        }
        local_5e8.m_pSelectors = (uint8 *)local_618.m_p;
        dxt5_endpoint_optimizer::compute(&local_490,&local_5d0,&local_5e8);
        paVar3[uVar8].first_endpoint = (uint)local_5e8.m_first_endpoint;
        paVar3[uVar8].second_endpoint = (uint)local_5e8.m_second_endpoint;
        dxt5_block::get_block_values
                  (local_508,paVar3[uVar8].first_endpoint,(uint)local_5e8.m_second_endpoint);
        pdVar21 = local_600;
        lVar9 = 0;
        do {
          uVar18 = local_508[(byte)(&g_dxt5_from_linear)[lVar9]];
          *(uint *)((long)local_5f8->alpha_values + lVar9 * 4 + local_5f0 + 0x48 + -0x48) = uVar18;
          auStack_4d8[lVar9] = uVar18;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        iVar10 = paVar3[uVar8].first_endpoint - paVar3[uVar8].second_endpoint;
        uVar14 = (uint)(iVar10 * iVar10) >> 3;
        if (0x7ff < uVar14) {
          uVar14 = 0x800;
        }
        if ((uint)(iVar10 * iVar10) < 8) {
          uVar14 = 1;
        }
        lVar9 = 0;
        do {
          auStack_4b8[lVar9] =
               (uint)(long)((((float)(int)lVar9 / 7.0) * -0.14999998 + 1.15) * (float)uVar14);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        bVar7 = this->m_has_etc_color_blocks;
        if (bVar7 != false) {
          uVar14 = 1;
          if ((6 < iVar10) && (uVar14 = (iVar10 + 0xcU) / 0x12, 0xe < uVar14)) {
            uVar14 = 0xf;
          }
          uVar15 = (uint)local_5e8.m_first_endpoint + (uint)local_5e8.m_second_endpoint + 1 >> 1 &
                   0xff;
          lVar9 = 0;
          do {
            uVar18 = determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar10 < 7]
                     [lVar9] * uVar14 + uVar15;
            if (0xfe < (int)uVar18) {
              uVar18 = 0xff;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            *(uint *)((long)local_5f8->alpha_values + lVar9 * 4 + local_5f0 + 0x48 + -0x48) = uVar18
            ;
            auStack_4d8[lVar9] = uVar18;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          paVar3[uVar8].first_endpoint = uVar15;
          paVar3[uVar8].second_endpoint = uVar14 << 4 | (uint)(iVar10 < 7) * 2 + 0xb;
        }
        local_560 = (ulong)this->m_num_alpha_blocks;
        if (local_560 != 0) {
          local_568 = local_600->m_blocks;
          local_550 = (local_600->m_block_encodings).m_p;
          bVar1 = local_600->m_has_subblocks;
          uVar13 = 0;
          do {
            local_558 = uVar13 + 1;
            local_530 = (ulong)paVar3[uVar8].blocks[uVar13 + 1].m_size;
            if (local_530 != 0) {
              local_538 = (*local_568)[0].field_0.c +
                          (local_600->m_params).m_alpha_component_indices[uVar13];
              local_540 = paVar3[uVar8].blocks[uVar13 + 1].m_p;
              local_548 = local_570[local_558].m_p;
              uVar13 = 0;
              do {
                local_520 = (ulong)local_540[uVar13];
                local_528 = (ulong)auStack_4b8[local_550[local_520]];
                lVar9 = 0;
                uVar11 = 0;
                do {
                  uVar15 = 0xffffffff;
                  lVar19 = 0;
                  uVar14 = 0;
                  do {
                    if (bVar7 == false) {
                      bVar17 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar19);
                      if ((local_5e8.m_reordered & 1U) == 0) {
                        bVar17 = *(byte *)((long)&g_dxt5_to_linear + lVar19);
                      }
                    }
                    else {
                      bVar17 = (byte)lVar19;
                    }
                    uVar16 = (uint)local_538[lVar9 * 4 +
                                             (ulong)(local_540[uVar13] >> (bVar1 & 0x1fU)) * 0x40] -
                             auStack_4d8[bVar17];
                    uVar20 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar20 = uVar16;
                    }
                    bVar22 = uVar20 < uVar15;
                    if (bVar22) {
                      uVar15 = uVar20;
                    }
                    if (bVar22) {
                      uVar14 = (uint)bVar17;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 8);
                  uVar11 = (ulong)uVar14 | uVar11 << 3;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 0x10);
                local_548[local_520] = uVar11 << 0x10 | local_528;
                uVar13 = uVar13 + 1;
              } while (uVar13 != local_530);
            }
            uVar13 = local_558;
          } while (local_558 != local_560);
        }
        local_5b0.m_alpha_comp_index = 0;
        local_5b0.m_highest_quality = true;
        local_5b0.m_pSelectors = (uint8 *)local_618.m_p;
        local_5b0.m_pPixels = paVar3[uVar8].pixels.m_p;
        local_5b0.m_num_pixels = paVar3[uVar8].pixels.m_size;
        local_5b0._48_2_ = (ushort)(local_600->m_params).m_perceptual << 8;
        local_5b0.m_error_to_beat = local_5e8.m_error;
        local_5b0.m_block_index = uVar12;
        local_578 = data;
        if (bVar7 == false) {
          bVar7 = dxt_endpoint_refiner::refine(&local_4e8,&local_5b0,&local_518);
          lVar9 = local_5f0;
          paVar3[uVar8].refined_alpha = bVar7;
          if (bVar7) {
            paVar3[uVar8].first_endpoint = (uint)local_518.m_low_color;
            paVar3[uVar8].second_endpoint = (uint)local_518.m_high_color;
            dxt5_block::get_block_values
                      (local_508,(uint)local_518.m_low_color,(uint)local_518.m_high_color);
            lVar19 = 0;
            do {
              *(uint *)((long)local_5f8->refined_alpha_values + lVar19 * 4 + lVar9) =
                   local_508[(byte)(&g_dxt5_from_linear)[lVar19]];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 8);
            goto LAB_0017bfad;
          }
        }
        else {
          paVar3[uVar8].refined_alpha = false;
        }
        uVar4 = *(undefined8 *)paVar3[uVar8].alpha_values;
        uVar5 = *(undefined8 *)(paVar3[uVar8].alpha_values + 2);
        uVar6 = *(undefined8 *)(paVar3[uVar8].alpha_values + 6);
        *(undefined8 *)(paVar3[uVar8].refined_alpha_values + 4) =
             *(undefined8 *)(paVar3[uVar8].alpha_values + 4);
        *(undefined8 *)(paVar3[uVar8].refined_alpha_values + 6) = uVar6;
        *(undefined8 *)paVar3[uVar8].refined_alpha_values = uVar4;
        *(undefined8 *)(paVar3[uVar8].refined_alpha_values + 2) = uVar5;
      }
LAB_0017bfad:
      uVar14 = uVar12 + uVar2 + 1;
      data = (uint64)uVar14;
      this = pdVar21;
    } while (uVar14 < (pdVar21->m_alpha_clusters).m_size);
  }
  if ((uint8 *)local_618.m_p != (uint8 *)0x0) {
    crnlib_free(local_618.m_p);
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt5_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks)
        {
            alpha_cluster& cluster = m_alpha_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_comp_index = 0;
            params.m_quality = cCRNDXTQualityUber;
            params.m_use_both_block_types = false;

            dxt5_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_first_endpoint;
            cluster.second_endpoint = results.m_second_endpoint;
            uint block_values[8], alpha_values[8];
            dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 8; i++)
            {
                alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
            }
            int delta = cluster.first_endpoint - cluster.second_endpoint;
            uint encoding_weight[8];
            for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
            {
                encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));
            }

            if (m_has_etc_color_blocks)
            {
                static const int stripped_modifier_table[2][8] = {
                    { -10, -7, -5, -2, 1, 4, 6, 9 },
                    { -10, -3, -2, -1, 0, 1, 2, 9 }
                };
                int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
                int modifier_index = delta <= 6 ? 13 : 11;
                int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
                const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
                for (int i = 0; i < 8; i++)
                {
                    alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                cluster.first_endpoint = base_codeword;
                cluster.second_endpoint = multiplier << 4 | modifier_index;
            }

            for (uint a = 0; a < m_num_alpha_blocks; a++)
            {
                uint component_index = m_params.m_alpha_component_indices[a];
                crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    uint weight = encoding_weight[m_block_encodings[b]];
                    uint64 selector = 0;
                    for (uint p = 0; p < 16; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 t = 0; t < 8; t++)
                        {
                            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t]
                                                                                       : g_dxt5_to_linear[t];
                            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
                            uint error = delta >= 0 ? delta : -delta;
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 3 | s_best;
                    }
                    m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
                }
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = false;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
            if (cluster.refined_alpha)
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
                dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
                for (uint i = 0; i < 8; i++)
                {
                    cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
                }
            }
            else
            {
                memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
            }
        }
    }